

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_monsters(void)

{
  wchar_t wVar1;
  int local_10;
  wchar_t local_c;
  wchar_t i;
  
  if ((player->is_dead & 1U) == 0) {
    wVar1 = rd_monsters_aux((chunk *)cave);
    if (wVar1 == L'\0') {
      wVar1 = rd_monsters_aux((chunk *)player->cave);
      if (wVar1 == L'\0') {
        for (local_10 = 0; local_10 < (int)(uint)player->cave->obj_max; local_10 = local_10 + 1) {
          if ((cave->objects[local_10] != (object *)0x0) &&
             (player->cave->objects[local_10] != (object *)0x0)) {
            cave->objects[local_10]->known = player->cave->objects[local_10];
          }
        }
        local_c = L'\0';
      }
      else {
        local_c = L'\xffffffff';
      }
    }
    else {
      local_c = L'\xffffffff';
    }
  }
  else {
    local_c = L'\0';
  }
  return local_c;
}

Assistant:

int rd_monsters(void)
{
	int i;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	if (rd_monsters_aux(cave))
		return -1;
	if (rd_monsters_aux(player->cave))
		return -1;

#if OBJ_RECOVER
	player->cave->objects = mem_zalloc((cave->obj_max + 1) * sizeof(struct object*));
	player->cave->obj_max = cave->obj_max;
	for (i = 0; i <= cave->obj_max; i++) {
		struct object *obj = cave->objects[i], *known_obj;
		if (!obj) continue;
		known_obj = object_new();
		obj->known = known_obj;
		object_copy(known_obj, obj);
		player->cave->objects[i] = known_obj;
	}
#else
	/* Associate known objects */
	for (i = 0; i < player->cave->obj_max; i++)
		if (cave->objects[i] && player->cave->objects[i])
			cave->objects[i]->known = player->cave->objects[i];
#endif
	return 0;
}